

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

double __thiscall
HighsMipSolverData::transformNewIntegerFeasibleSolution
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *sol,
          bool possibly_store_as_new_incumbent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  pointer pHVar3;
  HighsCallback *this_00;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  bool bVar7;
  HighsMipSolver *pHVar8;
  vector<double,_std::allocator<double>_> *pass_row_value;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  HighsOptions *pHVar9;
  ulong uVar10;
  bool bVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  double dVar15;
  double dVar16;
  double local_5a30;
  double integrality_violation_;
  double row_violation_;
  double bound_violation_;
  HighsMipSolver *local_5a08;
  undefined8 uStack_5a00;
  string local_59f8;
  HighsCDouble local_59d8;
  double local_59c0;
  HighsMipSolverData *local_59b8;
  double local_59b0;
  HighsSolution solution;
  string local_5940;
  HighsLp fixedModel;
  HighsLp local_5588;
  Highs tmpSolver;
  
  solution.value_valid = false;
  solution.dual_valid = false;
  solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::operator=(&solution.col_value,sol);
  solution.value_valid = true;
  presolve::HighsPostsolveStack::undoPrimal
            (&this->postSolveStack,this->mipsolver->options_mip_,&solution,-1);
  calculateRowValuesQuad(this->mipsolver->orig_model_,&solution,-1);
  bVar11 = true;
  local_59b8 = this;
  while( true ) {
    pass_row_value = &solution.row_value;
    bound_violation_ = 0.0;
    row_violation_ = 0.0;
    integrality_violation_ = 0.0;
    local_59d8.hi = 0.0;
    local_59d8.lo = 0.0;
    bVar7 = HighsMipSolver::solutionFeasible
                      (this->mipsolver,this->mipsolver->orig_model_,&solution.col_value,
                       pass_row_value,&bound_violation_,&row_violation_,&integrality_violation_,
                       &local_59d8);
    local_5a30 = local_59d8.hi;
    local_59c0 = local_59d8.lo;
    if (bVar7) break;
    if (!bVar11) {
      pHVar8 = this->mipsolver;
      if (!possibly_store_as_new_incumbent) goto LAB_002b91ff;
      local_5a30 = local_59d8.hi + local_59d8.lo;
      goto LAB_002b9259;
    }
    HighsLp::HighsLp(&fixedModel,this->mipsolver->orig_model_);
    pdVar6 = fixedModel.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = fixedModel.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (fixedModel.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        fixedModel.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      fixedModel.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           fixedModel.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    local_5a08 = this->mipsolver;
    uVar10 = (ulong)(uint)local_5a08->orig_model_->num_col_;
    __buf = extraout_RDX;
    if (uVar10 != 0) {
      pHVar3 = (local_5a08->orig_model_->integrality_).
               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = 0;
      do {
        if (pHVar3[uVar12] == kInteger) {
          dVar16 = round(pdVar4[uVar12]);
          uVar13 = SUB84(dVar16,0);
          uVar14 = (undefined4)((ulong)dVar16 >> 0x20);
          dVar2 = pdVar5[uVar12];
          dVar15 = dVar16;
          if (dVar16 <= dVar2) {
            dVar15 = dVar2;
          }
          pdVar5[uVar12] = dVar15;
          dVar2 = pdVar6[uVar12];
          if (dVar2 <= dVar16) {
            uVar13 = SUB84(dVar2,0);
            uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
          }
          pdVar6[uVar12] = (double)CONCAT44(uVar14,uVar13);
          __buf = extraout_RDX_00;
        }
        uVar12 = uVar12 + 1;
      } while (uVar10 != uVar12);
    }
    this = local_59b8;
    local_59b8->total_repair_lp = local_59b8->total_repair_lp + 1;
    local_59b0 = (local_5a08->options_mip_->super_HighsOptionsStruct).time_limit;
    HighsTimer::read(&local_5a08->timer_,0,__buf,(size_t)pass_row_value);
    local_5a08 = (HighsMipSolver *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    Highs::Highs(&tmpSolver);
    paVar1 = &local_59f8.field_2;
    local_59f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_59f8,"output_flag","");
    Highs::setOptionValue(&tmpSolver,&local_59f8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_59f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_59f8._M_dataplus._M_p);
    }
    local_59f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_59f8,"time_limit","");
    dVar2 = 0.1;
    if (0.1 <= local_59b0 - (double)local_5a08) {
      dVar2 = local_59b0 - (double)local_5a08;
    }
    Highs::setOptionValue(&tmpSolver,&local_59f8,dVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_59f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_59f8._M_dataplus._M_p);
    }
    local_59f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_59f8,"primal_feasibility_tolerance","");
    Highs::setOptionValue
              (&tmpSolver,&local_59f8,
               (this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_59f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_59f8._M_dataplus._M_p);
    }
    if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_root_presolve_only == true) {
      local_59f8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_59f8,"presolve","");
      Highs::setOptionValue(&tmpSolver,&local_59f8,&::kHighsOffString_abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_59f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_59f8._M_dataplus._M_p);
      }
    }
    HighsLp::HighsLp(&local_5588,&fixedModel);
    Highs::passModel(&tmpSolver,&local_5588);
    HighsLp::~HighsLp(&local_5588);
    HighsMipAnalysis::mipTimerStart(&this->mipsolver->analysis_,0x3a);
    Highs::run(&tmpSolver);
    HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0x3a);
    this->total_repair_lp_iterations =
         (long)tmpSolver.info_.super_HighsInfoStruct.simplex_iteration_count;
    if (tmpSolver.info_.super_HighsInfoStruct.primal_solution_status != 2) {
      Highs::~Highs(&tmpSolver);
      HighsLp::~HighsLp(&fixedModel);
      break;
    }
    this->total_repair_lp_feasible = this->total_repair_lp_feasible + 1;
    solution.value_valid = tmpSolver.solution_.value_valid;
    solution.dual_valid = tmpSolver.solution_.dual_valid;
    std::vector<double,_std::allocator<double>_>::operator=
              (&solution.col_value,&tmpSolver.solution_.col_value);
    std::vector<double,_std::allocator<double>_>::operator=
              (&solution.col_dual,&tmpSolver.solution_.col_dual);
    std::vector<double,_std::allocator<double>_>::operator=
              (&solution.row_value,&tmpSolver.solution_.row_value);
    std::vector<double,_std::allocator<double>_>::operator=
              (&solution.row_dual,&tmpSolver.solution_.row_dual);
    Highs::~Highs(&tmpSolver);
    HighsLp::~HighsLp(&fixedModel);
    bVar11 = false;
  }
  local_5a30 = local_5a30 + local_59c0;
  if ((((bVar7) && (this->mipsolver->submip == false)) &&
      (this_00 = this->mipsolver->callback_,
      (this_00->user_callback).super__Function_base._M_manager != (_Manager_type)0x0)) &&
     ((*(this_00->active).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 8) != 0)) {
    HighsCallback::clearHighsCallbackDataOut(this_00);
    (this->mipsolver->callback_->data_out).mip_solution =
         solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_5940._M_dataplus._M_p = (pointer)&local_5940.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5940,"Feasible solution","");
    interruptFromCallbackWithData(this,3,local_5a30,&local_5940);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5940._M_dataplus._M_p != &local_5940.field_2) {
      operator_delete(local_5940._M_dataplus._M_p);
    }
  }
  pHVar8 = this->mipsolver;
  if (possibly_store_as_new_incumbent) {
    if (!bVar7) {
LAB_002b9259:
      if (INFINITY <= pHVar8->solution_objective_) {
        pHVar9 = pHVar8->options_mip_;
LAB_002b92cc:
        bVar11 = false;
      }
      else {
        pHVar9 = pHVar8->options_mip_;
        dVar2 = (pHVar9->super_HighsOptionsStruct).mip_feasibility_tolerance;
        if ((dVar2 < pHVar8->bound_violation_) || (dVar2 < pHVar8->integrality_violation_))
        goto LAB_002b92cc;
        bVar11 = pHVar8->row_violation_ <= dVar2;
      }
      highsLogUser(&(pHVar9->super_HighsOptionsStruct).log_options,kWarning,
                   "Solution with objective %g has untransformed violations: bound = %.4g; integrality = %.4g; row = %.4g\n"
                   ,SUB84(local_5a30,0),bound_violation_,integrality_violation_,row_violation_);
      local_5a08 = (HighsMipSolver *)0x7ff0000000000000;
      uStack_5a00 = 0;
      if (!bVar11) {
        pHVar8 = this->mipsolver;
        pHVar8->row_violation_ = row_violation_;
        pHVar8->bound_violation_ = bound_violation_;
        pHVar8->integrality_violation_ = integrality_violation_;
        pdVar4 = (pHVar8->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (pHVar8->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        (pHVar8->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (pHVar8->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pdVar4 != (pointer)0x0) {
          operator_delete(pdVar4);
          pHVar8 = this->mipsolver;
        }
        uStack_5a00 = 0;
        local_5a08 = (HighsMipSolver *)0x7ff0000000000000;
        pHVar8->solution_objective_ = local_5a30;
      }
      goto LAB_002b937c;
    }
    pHVar8->row_violation_ = row_violation_;
    pHVar8->bound_violation_ = bound_violation_;
    pHVar8->integrality_violation_ = integrality_violation_;
    pdVar4 = (pHVar8->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    (pHVar8->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (pHVar8->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (pHVar8->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pdVar4 != (pointer)0x0) {
      operator_delete(pdVar4);
      pHVar8 = this->mipsolver;
    }
    pHVar8->solution_objective_ = local_5a30;
  }
LAB_002b91ff:
  dVar2 = pHVar8->model_->offset_;
  if (pHVar8->orig_model_->sense_ == kMaximize) {
    dVar16 = dVar2 + local_59d8.hi;
    uStack_5a00 = 0x8000000000000000;
    local_5a08 = (HighsMipSolver *)
                 -((dVar2 - (dVar16 - local_59d8.hi)) +
                   (local_59d8.hi - (dVar16 - (dVar16 - local_59d8.hi))) + local_59d8.lo + dVar16);
  }
  else {
    dVar16 = local_59d8.hi - dVar2;
    uStack_5a00 = 0x8000000000000000;
    local_5a08 = (HighsMipSolver *)
                 ((-dVar2 - (dVar16 - local_59d8.hi)) +
                  (local_59d8.hi - (dVar16 - (dVar16 - local_59d8.hi))) + local_59d8.lo + dVar16);
  }
LAB_002b937c:
  if (solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (double)local_5a08;
}

Assistant:

double HighsMipSolverData::transformNewIntegerFeasibleSolution(
    const std::vector<double>& sol,
    const bool possibly_store_as_new_incumbent) {
  HighsSolution solution;
  solution.col_value = sol;
  solution.value_valid = true;
  // Perform primal postsolve to get the original column values
  postSolveStack.undoPrimal(*mipsolver.options_mip_, solution);
  // Determine the row values, as they aren't computed in primal
  // postsolve
  HighsStatus return_status =
      calculateRowValuesQuad(*mipsolver.orig_model_, solution);
  if (kAllowDeveloperAssert) assert(return_status == HighsStatus::kOk);
  bool allow_try_again = true;
try_again:

  // compute the objective value in the original space
  double bound_violation_ = 0;
  double row_violation_ = 0;
  double integrality_violation_ = 0;
  HighsCDouble mipsolver_quad_objective_value = 0;
  bool feasible = mipsolver.solutionFeasible(
      mipsolver.orig_model_, solution.col_value, &solution.row_value,
      bound_violation_, row_violation_, integrality_violation_,
      mipsolver_quad_objective_value);
  double mipsolver_objective_value = double(mipsolver_quad_objective_value);
  if (!feasible && allow_try_again) {
    // printf(
    //     "trying to repair sol that is violated by %.12g bounds, %.12g "
    //     "integrality, %.12g rows\n",
    //     bound_violation_, integrality_violation_, row_violation_);
    HighsLp fixedModel = *mipsolver.orig_model_;
    fixedModel.integrality_.clear();
    for (HighsInt i = 0; i != mipsolver.orig_model_->num_col_; ++i) {
      if (mipsolver.orig_model_->integrality_[i] == HighsVarType::kInteger) {
        double solval = std::round(solution.col_value[i]);
        fixedModel.col_lower_[i] = std::max(fixedModel.col_lower_[i], solval);
        fixedModel.col_upper_[i] = std::min(fixedModel.col_upper_[i], solval);
      }
    }
    this->total_repair_lp++;
    double time_available = std::max(
        mipsolver.options_mip_->time_limit - mipsolver.timer_.read(), 0.1);
    Highs tmpSolver;
    const bool debug_report = false;
    if (debug_report) {
      tmpSolver.setOptionValue("log_dev_level", 2);
      tmpSolver.setOptionValue("highs_analysis_level", 4);
    } else {
      tmpSolver.setOptionValue("output_flag", false);
    }
    // tmpSolver.setOptionValue("simplex_scale_strategy", 0);
    // tmpSolver.setOptionValue("presolve", kHighsOffString);
    tmpSolver.setOptionValue("time_limit", time_available);
    tmpSolver.setOptionValue("primal_feasibility_tolerance",
                             mipsolver.options_mip_->mip_feasibility_tolerance);
    // check if only root presolve is allowed
    if (mipsolver.options_mip_->mip_root_presolve_only)
      tmpSolver.setOptionValue("presolve", kHighsOffString);
    tmpSolver.passModel(std::move(fixedModel));
    mipsolver.analysis_.mipTimerStart(kMipClockSimplexNoBasisSolveLp);
    tmpSolver.run();
    mipsolver.analysis_.mipTimerStop(kMipClockSimplexNoBasisSolveLp);

    this->total_repair_lp_iterations =
        tmpSolver.getInfo().simplex_iteration_count;
    if (tmpSolver.getInfo().primal_solution_status == kSolutionStatusFeasible) {
      this->total_repair_lp_feasible++;
      solution = tmpSolver.getSolution();
      allow_try_again = false;
      goto try_again;
    }
  }

  // Possible MIP solution callback
  if (!mipsolver.submip && feasible && mipsolver.callback_->user_callback &&
      mipsolver.callback_->active[kCallbackMipSolution]) {
    mipsolver.callback_->clearHighsCallbackDataOut();
    mipsolver.callback_->data_out.mip_solution = solution.col_value.data();
    const bool interrupt = interruptFromCallbackWithData(
        kCallbackMipSolution, mipsolver_objective_value, "Feasible solution");
    assert(!interrupt);
  }

  if (possibly_store_as_new_incumbent) {
    // Store the solution as incumbent in the original space if there
    // is no solution or if it is feasible
    if (feasible) {
      // if (!allow_try_again)
      //   printf("repaired solution with value %g\n",
      //   mipsolver_objective_value);
      // store
      mipsolver.row_violation_ = row_violation_;
      mipsolver.bound_violation_ = bound_violation_;
      mipsolver.integrality_violation_ = integrality_violation_;
      mipsolver.solution_ = std::move(solution.col_value);
      mipsolver.solution_objective_ = mipsolver_objective_value;
    } else {
      bool currentFeasible =
          mipsolver.solution_objective_ != kHighsInf &&
          mipsolver.bound_violation_ <=
              mipsolver.options_mip_->mip_feasibility_tolerance &&
          mipsolver.integrality_violation_ <=
              mipsolver.options_mip_->mip_feasibility_tolerance &&
          mipsolver.row_violation_ <=
              mipsolver.options_mip_->mip_feasibility_tolerance;
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kWarning,
                   "Solution with objective %g has untransformed violations: "
                   "bound = %.4g; integrality = %.4g; row = %.4g\n",
                   mipsolver_objective_value, bound_violation_,
                   integrality_violation_, row_violation_);
      if (!currentFeasible) {
        // if the current incumbent is non existent or also not feasible we
        // still store the new one
        mipsolver.row_violation_ = row_violation_;
        mipsolver.bound_violation_ = bound_violation_;
        mipsolver.integrality_violation_ = integrality_violation_;
        mipsolver.solution_ = std::move(solution.col_value);
        mipsolver.solution_objective_ = mipsolver_objective_value;
      }

      // return infinity so that it is not used for bounding
      return kHighsInf;
    }
  }
  // return the objective value in the transformed space
  if (mipsolver.orig_model_->sense_ == ObjSense::kMaximize)
    return -double(mipsolver_quad_objective_value + mipsolver.model_->offset_);

  return double(mipsolver_quad_objective_value - mipsolver.model_->offset_);
}